

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O3

string * __thiscall
llvm::yaml::escape_abi_cxx11_
          (string *__return_storage_ptr__,yaml *this,StringRef Input,bool EscapePrintable)

{
  size_type *psVar1;
  yaml yVar2;
  char cVar3;
  bool bVar4;
  ulong uVar5;
  long *plVar6;
  UTF8Decoded UVar7;
  char cVar8;
  uint uVar9;
  byte bVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  char *__lhs;
  yaml *pyVar12;
  StringRef Range;
  string HexStr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined4 local_34;
  
  local_34 = (undefined4)Input.Length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (Input.Data == (char *)0x0) {
    return __return_storage_ptr__;
  }
  pyVar12 = (yaml *)(Input.Data + (long)this);
  do {
    yVar2 = *this;
    uVar5 = (ulong)(byte)yVar2;
    if (0x1a < (byte)yVar2) {
      if (((yVar2 != (yaml)0x1b) && (yVar2 != (yaml)0x22)) && (yVar2 != (yaml)0x5c))
      goto switchD_00185fd7_caseD_1;
      goto LAB_0018606d;
    }
    switch(uVar5) {
    case 0:
      break;
    default:
switchD_00185fd7_caseD_1:
      if ((byte)yVar2 < 0x20) {
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_b8.field_2._M_local_buf + 1);
        if (uVar5 == 0) {
          local_b8.field_2._M_local_buf[0] = 0x30;
          paVar11 = &local_b8.field_2;
        }
        else {
          do {
            uVar9 = (uint)uVar5 & 0xf;
            bVar10 = (char)uVar9 + 0x37;
            if (uVar9 < 10) {
              bVar10 = (byte)uVar5 | 0x30;
            }
            *(byte *)((long)paVar11 + -1) = bVar10;
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)paVar11 + -1);
            bVar4 = 0xf < uVar5;
            uVar5 = uVar5 >> 4;
          } while (bVar4);
        }
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,paVar11,(undefined1 *)((long)&local_b8.field_2 + 1));
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_98,'\x02' - (char)local_58._M_string_length);
        plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x1bd988);
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        psVar1 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_78.field_2._M_allocated_capacity = *psVar1;
          local_78.field_2._8_8_ = plVar6[3];
        }
        else {
          local_78.field_2._M_allocated_capacity = *psVar1;
          local_78._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_78._M_string_length = plVar6[1];
        *plVar6 = (long)psVar1;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_78,(ulong)local_58._M_dataplus._M_p);
        psVar1 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_b8.field_2._M_allocated_capacity = *psVar1;
          local_b8.field_2._8_8_ = plVar6[3];
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        }
        else {
          local_b8.field_2._M_allocated_capacity = *psVar1;
          local_b8._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_b8._M_string_length = plVar6[1];
        *plVar6 = (long)psVar1;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_b8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
      }
      else if ((char)yVar2 < '\0') {
        Range.Length = (long)pyVar12 - (long)this;
        Range.Data = (char *)this;
        UVar7 = decodeUTF8(Range);
        if ((ulong)UVar7 >> 0x20 == 0) {
          local_58._M_string_length = 0x400000000;
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          encodeUTF8(0xfffd,(SmallVectorImpl<char> *)&local_58);
          std::__cxx11::string::replace
                    ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,
                     (char *)0x0,(ulong)local_58._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p == &local_58.field_2) {
            return __return_storage_ptr__;
          }
          free(local_58._M_dataplus._M_p);
          return __return_storage_ptr__;
        }
        uVar9 = UVar7.first;
        if ((int)uVar9 < 0x2028) {
          if ((uVar9 != 0x85) && (uVar9 != 0xa0)) goto LAB_001862c8;
LAB_00186304:
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        else {
          if ((uVar9 == 0x2028) || (uVar9 == 0x2029)) goto LAB_00186304;
LAB_001862c8:
          if (((char)local_34 == '\0') && (bVar4 = sys::unicode::isPrintable(uVar9), bVar4)) {
            std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)this);
          }
          else {
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_b8.field_2._M_local_buf + 1);
            uVar5 = (ulong)UVar7 & 0xffffffff;
            if (((ulong)UVar7 & 0xffffffff) == 0) {
              local_b8.field_2._M_local_buf[0] = 0x30;
              paVar11 = &local_b8.field_2;
            }
            else {
              do {
                uVar9 = (uint)uVar5 & 0xf;
                cVar3 = (char)uVar9;
                cVar8 = cVar3 + '7';
                if (uVar9 < 10) {
                  cVar8 = cVar3 + '0';
                }
                *(char *)((long)paVar11 + -1) = cVar8;
                paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)paVar11 + -1);
                bVar4 = 0xf < uVar5;
                uVar5 = uVar5 >> 4;
              } while (bVar4);
            }
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_58,paVar11,(undefined1 *)((long)&local_b8.field_2 + 1));
            cVar3 = (char)local_58._M_string_length;
            if (local_58._M_string_length < 3) {
              local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
              std::__cxx11::string::_M_construct((ulong)&local_98,'\x02' - cVar3);
              __lhs = "\\x";
LAB_0018642d:
              std::operator+(&local_78,__lhs,&local_98);
              std::operator+(&local_b8,&local_78,&local_58);
              std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,(ulong)local_b8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78._M_dataplus._M_p != &local_78.field_2) {
                operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1
                               );
              }
            }
            else {
              if (local_58._M_string_length < 5) {
                local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
                std::__cxx11::string::_M_construct((ulong)&local_98,'\x04' - cVar3);
                __lhs = "\\u";
                goto LAB_0018642d;
              }
              if (local_58._M_string_length < 9) {
                local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
                std::__cxx11::string::_M_construct((ulong)&local_98,'\b' - cVar3);
                __lhs = "\\U";
                goto LAB_0018642d;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
          }
        }
        this = this + (UVar7.second - 1);
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      goto LAB_00186072;
    case 7:
      break;
    case 8:
      break;
    case 9:
      break;
    case 10:
      break;
    case 0xb:
      break;
    case 0xc:
      break;
    case 0xd:
    }
LAB_0018606d:
    std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_00186072:
    this = this + 1;
    if (this == pyVar12) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::string yaml::escape(StringRef Input, bool EscapePrintable) {
  std::string EscapedInput;
  for (StringRef::iterator i = Input.begin(), e = Input.end(); i != e; ++i) {
    if (*i == '\\')
      EscapedInput += "\\\\";
    else if (*i == '"')
      EscapedInput += "\\\"";
    else if (*i == 0)
      EscapedInput += "\\0";
    else if (*i == 0x07)
      EscapedInput += "\\a";
    else if (*i == 0x08)
      EscapedInput += "\\b";
    else if (*i == 0x09)
      EscapedInput += "\\t";
    else if (*i == 0x0A)
      EscapedInput += "\\n";
    else if (*i == 0x0B)
      EscapedInput += "\\v";
    else if (*i == 0x0C)
      EscapedInput += "\\f";
    else if (*i == 0x0D)
      EscapedInput += "\\r";
    else if (*i == 0x1B)
      EscapedInput += "\\e";
    else if ((unsigned char)*i < 0x20) { // Control characters not handled above.
      std::string HexStr = utohexstr(*i);
      EscapedInput += "\\x" + std::string(2 - HexStr.size(), '0') + HexStr;
    } else if (*i & 0x80) { // UTF-8 multiple code unit subsequence.
      UTF8Decoded UnicodeScalarValue
        = decodeUTF8(StringRef(i, Input.end() - i));
      if (UnicodeScalarValue.second == 0) {
        // Found invalid char.
        SmallString<4> Val;
        encodeUTF8(0xFFFD, Val);
        EscapedInput.insert(EscapedInput.end(), Val.begin(), Val.end());
        // FIXME: Error reporting.
        return EscapedInput;
      }
      if (UnicodeScalarValue.first == 0x85)
        EscapedInput += "\\N";
      else if (UnicodeScalarValue.first == 0xA0)
        EscapedInput += "\\_";
      else if (UnicodeScalarValue.first == 0x2028)
        EscapedInput += "\\L";
      else if (UnicodeScalarValue.first == 0x2029)
        EscapedInput += "\\P";
      else if (!EscapePrintable &&
               sys::unicode::isPrintable(UnicodeScalarValue.first))
        EscapedInput += StringRef(i, UnicodeScalarValue.second);
      else {
        std::string HexStr = utohexstr(UnicodeScalarValue.first);
        if (HexStr.size() <= 2)
          EscapedInput += "\\x" + std::string(2 - HexStr.size(), '0') + HexStr;
        else if (HexStr.size() <= 4)
          EscapedInput += "\\u" + std::string(4 - HexStr.size(), '0') + HexStr;
        else if (HexStr.size() <= 8)
          EscapedInput += "\\U" + std::string(8 - HexStr.size(), '0') + HexStr;
      }
      i += UnicodeScalarValue.second - 1;
    } else
      EscapedInput.push_back(*i);
  }
  return EscapedInput;
}